

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O2

DdNode * Llb_NonlinCreateCube2(Llb_Mgr_t *p,Llb_Prt_t *pPart1,Llb_Prt_t *pPart2)

{
  DdManager *pDVar1;
  abctime aVar2;
  Llb_Var_t *pLVar3;
  int iVar4;
  DdNode *pDVar5;
  int i;
  DdNode *local_40;
  
  pDVar1 = p->dd;
  aVar2 = pDVar1->TimeStop;
  pDVar1->TimeStop = 0;
  local_40 = Cudd_ReadOne(pDVar1);
  Cudd_Ref(local_40);
  i = 0;
  do {
    if (pPart1->vVars->nSize <= i) {
      Cudd_Deref(local_40);
      p->dd->TimeStop = aVar2;
      return local_40;
    }
    iVar4 = Vec_IntEntry(pPart1->vVars,i);
    pLVar3 = p->pVars[iVar4];
    iVar4 = pLVar3->vParts->nSize;
    if (iVar4 < 1) {
      __assert_fail("Vec_IntSize(pVar->vParts) > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb3Image.c"
                    ,0xb6,"DdNode *Llb_NonlinCreateCube2(Llb_Mgr_t *, Llb_Prt_t *, Llb_Prt_t *)");
    }
    if (iVar4 == 2) {
      iVar4 = Vec_IntEntry(pLVar3->vParts,0);
      if (iVar4 == pPart1->iPart) {
        iVar4 = Vec_IntEntry(pLVar3->vParts,1);
        if (iVar4 != pPart2->iPart) goto LAB_0074fdba;
LAB_0074fddc:
        pDVar1 = p->dd;
        pDVar5 = Cudd_bddIthVar(pDVar1,pLVar3->iVar);
        pDVar5 = Cudd_bddAnd(pDVar1,local_40,pDVar5);
        Cudd_Ref(pDVar5);
        Cudd_RecursiveDeref(p->dd,local_40);
        local_40 = pDVar5;
      }
      else {
LAB_0074fdba:
        iVar4 = Vec_IntEntry(pLVar3->vParts,0);
        if (iVar4 == pPart2->iPart) {
          iVar4 = Vec_IntEntry(pLVar3->vParts,1);
          if (iVar4 == pPart1->iPart) goto LAB_0074fddc;
        }
      }
    }
    i = i + 1;
  } while( true );
}

Assistant:

DdNode * Llb_NonlinCreateCube2( Llb_Mgr_t * p, Llb_Prt_t * pPart1, Llb_Prt_t * pPart2 )
{
    DdNode * bCube, * bTemp;
    Llb_Var_t * pVar;
    int i;
    abctime TimeStop;
    TimeStop = p->dd->TimeStop; p->dd->TimeStop = 0;
    bCube = Cudd_ReadOne(p->dd);   Cudd_Ref( bCube );
    Llb_PartForEachVar( p, pPart1, pVar, i )
    {
        assert( Vec_IntSize(pVar->vParts) > 0 );
        if ( Vec_IntSize(pVar->vParts) != 2 )
            continue;
        if ( (Vec_IntEntry(pVar->vParts, 0) == pPart1->iPart && Vec_IntEntry(pVar->vParts, 1) == pPart2->iPart) ||
             (Vec_IntEntry(pVar->vParts, 0) == pPart2->iPart && Vec_IntEntry(pVar->vParts, 1) == pPart1->iPart) )
        {
            bCube = Cudd_bddAnd( p->dd, bTemp = bCube, Cudd_bddIthVar(p->dd, pVar->iVar) );   Cudd_Ref( bCube );
            Cudd_RecursiveDeref( p->dd, bTemp );
        }
    }
    Cudd_Deref( bCube );
    p->dd->TimeStop = TimeStop;
    return bCube;
}